

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# max_flow.h
# Opt level: O1

void __thiscall
max_flow_algo::max_flow_algo
          (max_flow_algo *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *adjj,vector<int,_std::allocator<int>_> *x)

{
  pointer pvVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  value_type_conflict1 local_3c;
  queue<int,_std::deque<int,_std::allocator<int>_>_> *local_38;
  
  this->WORK_OP_RELABEL = 9;
  this->GLOBAL_UPDATE_FRQ = 0.51;
  this->WORK_NODE_TO_EDGES = 4;
  (this->m_active).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->m_active).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->m_excess).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_excess).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_excess).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->m_distance).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_distance).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_distance).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_distance).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_active).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 4) = 0;
  (this->m_active).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->m_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->m_Q).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)0x0;
  (this->m_Q).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  (this->m_Q).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start
  ._M_cur = (_Elt_pointer)0x0;
  (this->m_Q).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start
  ._M_first = (_Elt_pointer)0x0;
  (this->m_Q).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start
  ._M_last = (_Elt_pointer)0x0;
  (this->m_Q).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start
  ._M_node = (_Map_pointer)0x0;
  (this->m_Q).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_Q).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_Q).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_Q).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)&this->m_Q,0);
  (this->m_bfstouched).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->m_bfstouched).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this->m_bfstouched).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->m_bfstouched).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->m_bfstouched).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->flow).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->flow).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->flow).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->adj = adjj;
  this->active = x;
  local_38 = &this->m_Q;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&this->flow,
           ((long)(adjj->
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(adjj->
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  pvVar1 = (this->adj->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((this->adj->
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pvVar1) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      local_3c = 0;
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)
                 ((long)&(((this->flow).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data + lVar3),
                 *(long *)((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish + lVar3) -
                 *(long *)((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start + lVar3) >> 2,&local_3c);
      uVar4 = uVar4 + 1;
      pvVar1 = (this->adj->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar2 = ((long)(this->adj->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
              -0x5555555555555555;
      lVar3 = lVar3 + 0x18;
    } while (uVar4 <= uVar2 && uVar2 - uVar4 != 0);
  }
  return;
}

Assistant:

max_flow_algo(std::vector<std::vector<int>> &adjj, std::vector<int> &x)
        : adj(adjj), active(x)
    {
        flow.resize(adj.size());

        for (int i = 0; i < adj.size(); i++)
        {
            flow[i].resize(adj[i].size(), 0);
        }
    }